

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mau.cpp
# Opt level: O3

void DecrementLoggerRefs(void)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&LoggerLock);
  if (iVar1 == 0) {
    LoggerRefs = LoggerRefs - 1;
    pthread_mutex_unlock((pthread_mutex_t *)&LoggerLock);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

static void DecrementLoggerRefs()
{
    Locker locker(LoggerLock);

    --LoggerRefs;
    MAU_DEBUG_ASSERT(LoggerRefs >= 0);

#ifdef MAU_DLL
    // Stop logger when built as DLL
    if (LoggerRefs == 0)
        logger::Stop();
#endif
}